

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptGeneratorFunction.cpp
# Opt level: O1

Var Js::JavascriptGeneratorFunction::EntryGeneratorFunctionImplementation
              (RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  JavascriptLibrary *this;
  ThreadContext *pTVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  JavascriptGeneratorFunction *pJVar6;
  Var aValue;
  DynamicObject *prototype;
  JavascriptGenerator *this_00;
  int in_stack_00000010;
  undefined1 local_40 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != (int)args.super_Arguments.Values) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptGeneratorFunction.cpp"
                                ,0x6b,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00bddf4e;
    *puVar5 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_40 = (undefined1  [8])args.super_Arguments.Values;
  ArgumentReader::AdjustArguments
            ((ArgumentReader *)local_40,(CallInfo *)&args.super_Arguments.Values);
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptGeneratorFunction.cpp"
                                ,0x6d,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar4) {
LAB_00bddf4e:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  this = (pSVar1->super_ScriptContextBase).javascriptLibrary;
  pJVar6 = VarTo<Js::JavascriptGeneratorFunction,Js::RecyclableObject>(function);
  aValue = JavascriptOperators::GetPropertyNoCache(function,0x124,pSVar1);
  bVar4 = VarIs<Js::DynamicObject>(aValue);
  if (bVar4) {
    prototype = UnsafeVarTo<Js::DynamicObject>(aValue);
  }
  else {
    prototype = (this->super_JavascriptLibraryBase).generatorPrototype.ptr;
  }
  this_00 = JavascriptLibrary::CreateGenerator
                      (this,(Arguments *)local_40,
                       &((pJVar6->scriptFunction).ptr)->super_ScriptFunction,
                       &prototype->super_RecyclableObject);
  if ((((((pJVar6->scriptFunction).ptr)->super_ScriptFunction).super_ScriptFunctionBase.
        super_JavascriptFunction.functionInfo.ptr)->attributes & (GeneratorWithComplexParams|Module)
      ) != None) {
    pTVar2 = pSVar1->threadContext;
    bVar4 = pTVar2->reentrancySafeOrHandled;
    pTVar2->reentrancySafeOrHandled = true;
    JavascriptGenerator::CallGenerator
              (this_00,(this->super_JavascriptLibraryBase).undefinedValue.ptr,Normal);
    pTVar2->reentrancySafeOrHandled = bVar4;
  }
  JavascriptGenerator::SetSuspendedStart(this_00);
  return this_00;
}

Assistant:

Var JavascriptGeneratorFunction::EntryGeneratorFunctionImplementation(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);
        ARGUMENTS(args, callInfo);

        Assert(!(callInfo.Flags & CallFlags_New));

        auto* scriptContext = function->GetScriptContext();
        auto* library = scriptContext->GetLibrary();
        auto* generatorFunction = VarTo<JavascriptGeneratorFunction>(function);

        Var prototype = JavascriptOperators::GetPropertyNoCache(function, Js::PropertyIds::prototype, scriptContext);

        // fall back to the original prototype if we have an invalid prototype object
        DynamicObject* protoObject = VarIs<DynamicObject>(prototype) ?
            UnsafeVarTo<DynamicObject>(prototype) : library->GetGeneratorPrototype();

        JavascriptGenerator* generator = library->CreateGenerator(
            args,
            generatorFunction->scriptFunction,
            protoObject);

        // Call a next on the generator to execute till the beginning of the body
        FunctionInfo* funcInfo = generatorFunction->scriptFunction->GetFunctionInfo();
        if (funcInfo->GetGeneratorWithComplexParams() || funcInfo->IsModule())
        BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
        {
            generator->CallGenerator(library->GetUndefined(), ResumeYieldKind::Normal);
        }
        END_SAFE_REENTRANT_CALL

        generator->SetSuspendedStart();

        return generator;
    }